

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O2

void __thiscall
utObjImportExport_issue1453_segfault_Test::~utObjImportExport_issue1453_segfault_Test
          (utObjImportExport_issue1453_segfault_Test *this)

{
  AbstractImportExportBase::~AbstractImportExportBase((AbstractImportExportBase *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utObjImportExport, issue1453_segfault ) {
    static const char *ObjModel =
        "v  0.0  0.0  0.0\n"
        "v  0.0  0.0  1.0\n"
        "v  0.0  1.0  0.0\n"
        "v  0.0  1.0  1.0\n"
        "v  1.0  0.0  0.0\n"
        "v  1.0  0.0  1.0\n"
        "v  1.0  1.0  0.0\n"
        "v  1.0  1.0  1.0\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory( ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure );
    EXPECT_EQ( nullptr, scene );
}